

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readoldpsm.c
# Opt level: O0

int it_old_psm_read_samples(IT_SAMPLE **sample,DUMBFILE *f,int *num)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ushort uVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  void *__base;
  DUMBFILE *f_00;
  void *pvVar9;
  uint *in_RDX;
  long lVar10;
  long *in_RDI;
  IT_SAMPLE *s;
  IT_SAMPLE *meh;
  int32 sample_bytes;
  uchar *sdata;
  uchar *buffer;
  int delta;
  int finetune;
  int flags;
  int offset;
  int snum;
  int true_num;
  int count;
  int o;
  int n;
  long in_stack_ffffffffffffff88;
  DUMBFILE *in_stack_ffffffffffffff98;
  int32 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  uint local_30;
  int local_28;
  uint local_24;
  
  uVar3 = *in_RDX;
  __base = malloc((long)(int)(uVar3 << 6));
  if (__base != (void *)0x0) {
    iVar5 = dumbfile_getnc(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                           in_stack_ffffffffffffff98);
    if ((int)(uVar3 * 0x40) <= iVar5) {
      local_30 = 0;
      for (local_24 = 0; (int)local_24 < (int)uVar3; local_24 = local_24 + 1) {
        uVar6 = (uint)CONCAT11(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x2e)),
                               *(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x2d)));
        if ((uVar6 == 0) || (0xff < uVar6)) goto LAB_009a4ad5;
        if (local_30 < uVar6) {
          local_30 = uVar6;
        }
      }
      if ((int)local_30 <= (int)uVar3) {
LAB_009a41fd:
        qsort(__base,(long)(int)uVar3,0x40,psm_sample_compare);
        for (local_24 = 0; (int)local_24 < (int)local_30; local_24 = local_24 + 1) {
          *(undefined1 *)(*in_RDI + (long)(int)local_24 * 0x68 + 0x32) = 0;
        }
        local_24 = 0;
        do {
          if ((int)uVar3 <= (int)local_24) {
            free(__base);
            return 0;
          }
          f_00 = (DUMBFILE *)
                 (*in_RDI +
                 (long)(int)(CONCAT11(*(undefined1 *)
                                       ((long)__base + (long)(int)(local_24 * 0x40 + 0x2e)),
                                      *(undefined1 *)
                                       ((long)__base + (long)(int)(local_24 * 0x40 + 0x2d))) - 1) *
                 0x68);
          lVar10 = (long)(int)(local_24 << 6);
          *(undefined8 *)((long)&f_00[1].file + 3) = *(undefined8 *)((long)__base + lVar10);
          *(undefined4 *)((long)&f_00[1].pos + 3) = *(undefined4 *)((long)__base + lVar10 + 8);
          *(undefined1 *)((long)&f_00[1].pos + 7) = *(undefined1 *)((long)__base + lVar10 + 0xc);
          *(undefined1 *)&f_00[2].dfs = 0;
          lVar10 = (long)(int)(local_24 << 6);
          f_00->dfs = *(DUMBFILE_SYSTEM **)((long)__base + lVar10 + 0xd);
          f_00->file = *(void **)((long)__base + lVar10 + 0x15);
          f_00->pos = *(long *)((long)__base + lVar10 + 0x1d);
          *(undefined1 *)&f_00[1].dfs = 0;
          bVar1 = *(byte *)((long)__base + (long)(int)(local_24 * 0x40 + 0x2f));
          *(uint *)&f_00[2].file =
               CONCAT13(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x33)),
                        CONCAT12(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x32))
                                 ,CONCAT11(*(undefined1 *)
                                            ((long)__base + (long)(int)(local_24 * 0x40 + 0x31)),
                                           *(undefined1 *)
                                            ((long)__base + (long)(int)(local_24 * 0x40 + 0x30)))));
          *(uint *)((long)&f_00[2].file + 4) =
               CONCAT13(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x37)),
                        CONCAT12(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x36))
                                 ,CONCAT11(*(undefined1 *)
                                            ((long)__base + (long)(int)(local_24 * 0x40 + 0x35)),
                                           *(undefined1 *)
                                            ((long)__base + (long)(int)(local_24 * 0x40 + 0x34)))));
          *(uint *)&f_00[2].pos =
               CONCAT13(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x3b)),
                        CONCAT12(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x3a))
                                 ,CONCAT11(*(undefined1 *)
                                            ((long)__base + (long)(int)(local_24 * 0x40 + 0x39)),
                                           *(undefined1 *)
                                            ((long)__base + (long)(int)(local_24 * 0x40 + 0x38)))));
          if (0 < *(int *)&f_00[2].file) {
            bVar2 = *(byte *)((long)__base + (long)(int)(local_24 * 0x40 + 0x3c));
            *(undefined1 *)((long)&f_00[2].dfs + 4) =
                 *(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x3d));
            *(uint *)((long)&f_00[2].pos + 4) =
                 (uint)CONCAT11(*(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x3f)),
                                *(undefined1 *)((long)__base + (long)(int)(local_24 * 0x40 + 0x3e)))
            ;
            if ((bVar2 & 0xf) == 0) {
              *(undefined2 *)((long)&f_00[3].file + 4) = 0;
            }
            else {
              uVar4 = bVar2 & 0xf;
              if (7 < uVar4) {
                uVar4 = uVar4 - 0x10;
              }
              *(ushort *)((long)&f_00[3].file + 4) = uVar4 << 5;
            }
            *(byte *)((long)&f_00[2].dfs + 2) = *(byte *)((long)&f_00[2].dfs + 2) | 1;
            if ((bVar1 & 0x41) == 0) {
              if ((bVar1 & 0x20) != 0) {
                *(byte *)((long)&f_00[2].dfs + 2) = *(byte *)((long)&f_00[2].dfs + 2) | 0x40;
              }
              if ((bVar1 & 4) != 0) {
                *(byte *)((long)&f_00[2].dfs + 2) = *(byte *)((long)&f_00[2].dfs + 2) | 2;
              }
              if ((bVar1 & 0x80) != 0) {
                *(byte *)((long)&f_00[2].dfs + 2) = *(byte *)((long)&f_00[2].dfs + 2) | 0x10;
                if (*(uint *)&f_00[2].file < (uint)f_00[2].pos) {
                  *(undefined4 *)&f_00[2].pos = *(undefined4 *)&f_00[2].file;
                }
                else if (*(uint *)((long)&f_00[2].file + 4) < (uint)f_00[2].pos) {
                  *(int *)&f_00[2].file = (int)f_00[2].pos;
                }
                else {
                  *(byte *)((long)&f_00[2].dfs + 2) = *(byte *)((long)&f_00[2].dfs + 2) & 0xef;
                }
              }
              *(undefined1 *)((long)&f_00[2].dfs + 3) = 0x40;
              *(undefined1 *)&f_00[3].file = 0;
              *(undefined1 *)((long)&f_00[3].file + 1) = 0;
              *(undefined1 *)((long)&f_00[3].file + 2) = 0;
              *(undefined1 *)((long)&f_00[3].file + 3) = 0;
              *(undefined4 *)&f_00[4].dfs = 0xffffffff;
              iVar7 = 1;
              if ((bVar1 & 4) != 0) {
                iVar7 = 2;
              }
              iVar7 = *(int *)&f_00[2].file * iVar7;
              pvVar9 = malloc((long)iVar7);
              f_00[3].pos = (long)pvVar9;
              if (((f_00[3].pos == 0) ||
                  (iVar8 = dumbfile_seek(f_00,in_stack_ffffffffffffff88,0), iVar8 != 0)) ||
                 (iVar5 = dumbfile_getnc(in_stack_ffffffffffffffa8,iVar7,in_stack_ffffffffffffff98),
                 iVar5 < iVar7)) goto LAB_009a4ad5;
              in_stack_ffffffffffffffa8 = (char *)f_00[3].pos;
              if ((bVar1 & 0x10) == 0) {
                uVar4 = 0;
                if ((bVar1 & 8) == 0) {
                  if ((bVar1 & 4) == 0) {
                    for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                      uVar4 = (short)in_stack_ffffffffffffffa8[local_28] + uVar4;
                      *(char *)(f_00[3].pos + (long)local_28) = (char)uVar4;
                    }
                  }
                  else {
                    for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                      uVar4 = CONCAT11(in_stack_ffffffffffffffa8[local_28 * 2 + 1],
                                       in_stack_ffffffffffffffa8[local_28 << 1]) + uVar4;
                      *(ushort *)(f_00[3].pos + (long)local_28 * 2) = uVar4;
                    }
                  }
                }
                else if ((bVar1 & 4) == 0) {
                  for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                    uVar4 = (short)in_stack_ffffffffffffffa8[local_28] + uVar4;
                    *(byte *)(f_00[3].pos + (long)local_28) = (byte)uVar4 ^ 0x80;
                  }
                }
                else {
                  for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                    uVar4 = CONCAT11(in_stack_ffffffffffffffa8[local_28 * 2 + 1],
                                     in_stack_ffffffffffffffa8[local_28 << 1]) + uVar4;
                    *(ushort *)(f_00[3].pos + (long)local_28 * 2) = uVar4 ^ 0x8000;
                  }
                }
              }
              else if ((bVar1 & 8) == 0) {
                if ((bVar1 & 4) == 0) {
                  memcpy((void *)f_00[3].pos,in_stack_ffffffffffffffa8,(long)*(int *)&f_00[2].file);
                }
                else {
                  for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                    *(ushort *)(f_00[3].pos + (long)local_28 * 2) =
                         CONCAT11(in_stack_ffffffffffffffa8[local_28 * 2 + 1],
                                  in_stack_ffffffffffffffa8[local_28 << 1]);
                  }
                }
              }
              else if ((bVar1 & 4) == 0) {
                for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                  *(byte *)(f_00[3].pos + (long)local_28) =
                       in_stack_ffffffffffffffa8[local_28] ^ 0x80;
                }
              }
              else {
                for (local_28 = 0; local_28 < *(int *)&f_00[2].file; local_28 = local_28 + 1) {
                  *(ushort *)(f_00[3].pos + (long)local_28 * 2) =
                       CONCAT11(in_stack_ffffffffffffffa8[local_28 * 2 + 1],
                                in_stack_ffffffffffffffa8[local_28 << 1]) ^ 0x8000;
                }
              }
            }
            else {
              *(byte *)((long)&f_00[2].dfs + 2) = *(byte *)((long)&f_00[2].dfs + 2) & 0xfe;
            }
          }
          local_24 = local_24 + 1;
        } while( true );
      }
      in_stack_ffffffffffffff98 = (DUMBFILE *)realloc((void *)*in_RDI,(long)(int)local_30 * 0x68);
      local_24 = uVar3;
      if (in_stack_ffffffffffffff98 != (DUMBFILE *)0x0) {
        for (; (int)local_24 < (int)local_30; local_24 = local_24 + 1) {
          *(undefined8 *)((long)in_stack_ffffffffffffff98 + (long)(int)local_24 * 0x68 + 0x58) = 0;
        }
        *in_RDI = (long)in_stack_ffffffffffffff98;
        *in_RDX = local_30;
        goto LAB_009a41fd;
      }
    }
LAB_009a4ad5:
    free(__base);
  }
  return -1;
}

Assistant:

static int it_old_psm_read_samples(IT_SAMPLE ** sample, DUMBFILE * f, int * num)
{
    int n, o, count = *num, true_num, snum, offset, flags, finetune, delta;

    unsigned char * buffer;
	const unsigned char * sdata;
    int32 sample_bytes;

	buffer = malloc(count * 64);
	if (!buffer) goto error;

    if (dumbfile_getnc((char *)buffer, count * 64, f) < count * 64) goto error_fb;

	true_num = 0;

	for (n = 0; n < count; n++) {
		snum = buffer[(n * 64) + 45] | (buffer[(n * 64) + 46] << 8);
		if ((snum < 1) || (snum > 255)) goto error_fb;
		if (true_num < snum) true_num = snum;
	}

	if (true_num > count) {
		IT_SAMPLE * meh = realloc(*sample, true_num * sizeof(*meh));
		if (!meh) goto error_fb;
		for (n = count; n < true_num; n++) {
			meh[n].data = NULL;
		}
		*sample = meh;
		*num = true_num;
	}

	qsort(buffer, count, 64, &psm_sample_compare);

	for (n = 0; n < true_num; n++) {
		(*sample)[n].flags = 0;
	}

	for (n = 0; n < count; n++) {
		IT_SAMPLE * s;
		snum = buffer[(n * 64) + 45] | (buffer[(n * 64) + 46] << 8);
		s = &((*sample)[snum - 1]);
		memcpy(s->filename, buffer + (n * 64), 13);
		s->filename[13] = 0;
		memcpy(s->name, buffer + (n * 64) + 13, 24);
		s->name[24] = 0;
		offset = buffer[(n * 64) + 37] | (buffer[(n * 64) + 38] << 8) |
				 (buffer[(n * 64) + 39] << 16) | (buffer[(n * 64) + 40] << 24);
		flags = buffer[(n * 64) + 47];
		s->length = buffer[(n * 64) + 48] | (buffer[(n * 64) + 49] << 8) |
					(buffer[(n * 64) + 50] << 16) | (buffer[(n * 64) + 51] << 24);
		s->loop_start = buffer[(n * 64) + 52] | (buffer[(n * 64) + 53] << 8) |
						(buffer[(n * 64) + 54] << 16) | (buffer[(n * 64) + 55] << 24);
		s->loop_end = buffer[(n * 64) + 56] | (buffer[(n * 64) + 57] << 8) |
					  (buffer[(n * 64) + 58] << 16) | (buffer[(n * 64) + 59] << 24);

		if (s->length <= 0) continue;

		finetune = buffer[(n * 64) + 60];
		s->default_volume = buffer[(n * 64) + 61];
		s->C5_speed = buffer[(n * 64) + 62] | (buffer[(n * 64) + 63] << 8);
		if (finetune & 15) {
			finetune &= 15;
			if (finetune >= 8) finetune -= 16;
			//s->C5_speed = (long)((double)s->C5_speed * pow(DUMB_PITCH_BASE, finetune*32));
			s->finetune = finetune * 32;
		}
		else s->finetune = 0;

		s->flags |= IT_SAMPLE_EXISTS;
		if (flags & 0x41) {
			s->flags &= ~IT_SAMPLE_EXISTS;
			continue;
		}
		if (flags & 0x20) s->flags |= IT_SAMPLE_PINGPONG_LOOP;
		if (flags & 4) s->flags |= IT_SAMPLE_16BIT;

		if (flags & 0x80) {
			s->flags |= IT_SAMPLE_LOOP;
			if ((unsigned int)s->loop_end > (unsigned int)s->length)
				s->loop_end = s->length;
			else if ((unsigned int)s->loop_start >= (unsigned int)s->loop_end)
				s->flags &= ~IT_SAMPLE_LOOP;
			else
				s->length = s->loop_end;
		}

		s->global_volume = 64;

		s->vibrato_speed = 0;
		s->vibrato_depth = 0;
		s->vibrato_rate = 0;
		s->vibrato_waveform = IT_VIBRATO_SINE;
		s->max_resampling_quality = -1;

        sample_bytes = s->length * ((flags & 4) ? 2 : 1);
        s->data = malloc(sample_bytes);
		if (!s->data) goto error_fb;

        if (dumbfile_seek(f, offset, DFS_SEEK_SET) || dumbfile_getnc(s->data, sample_bytes, f) < sample_bytes) goto error_fb;
        sdata = ( const unsigned char * ) s->data;

		if (flags & 0x10) {
			if (flags & 8) {
				if (flags & 4) {
					for (o = 0; o < s->length; o++)
						((short *)s->data)[o] = (sdata[o * 2] | (sdata[(o * 2) + 1] << 8)) ^ 0x8000;
				} else {
					for (o = 0; o < s->length; o++)
						((signed char *)s->data)[o] = sdata[o] ^ 0x80;
				}
			} else {
				if (flags & 4) {
					for (o = 0; o < s->length; o++)
						((short *)s->data)[o] = sdata[o * 2] | (sdata[(o * 2) + 1] << 8);
				} else {
					memcpy(s->data, sdata, s->length);
				}
			}
		} else {
			delta = 0;
			if (flags & 8) {
				/* unsigned delta? mehhh, does anything even use this? */
				if (flags & 4) {
					for (o = 0; o < s->length; o++) {
						delta += (short)(sdata[o * 2] | (sdata[(o * 2) + 1] << 8));
						((short *)s->data)[o] = delta ^ 0x8000;
					}
				} else {
					for (o = 0; o < s->length; o++) {
						delta += (signed char)sdata[o];
						((signed char *)s->data)[o] = delta ^ 0x80;
					}
				}
			} else {
				if (flags & 4) {
					for (o = 0; o < s->length; o++) {
						delta += (short)(sdata[o * 2] | (sdata[(o * 2) + 1] << 8));
						((short *)s->data)[o] = delta;
					}
				} else {
					for (o = 0; o < s->length; o++) {
						delta += (signed char)sdata[o];
						((signed char *)s->data)[o] = delta;
					}
				}
			}
		}
	}

	free(buffer);

	return 0;

error_fb:
	free(buffer);
error:
	return -1;
}